

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

_Bool unshield_file_save_raw(Unshield *unshield,int index,char *filename)

{
  bool bVar1;
  _Bool _Var2;
  void *buffer;
  FileDescriptor *file_descriptor;
  UnshieldReader *reader;
  uint64_t uVar3;
  void *pvVar4;
  size_t sVar5;
  char *format;
  int line;
  size_t size;
  uint uVar6;
  _Bool _Var7;
  
  buffer = malloc(0x10000);
  if (unshield == (Unshield *)0x0) {
LAB_00103a04:
    reader = (UnshieldReader *)0x0;
  }
  else {
    file_descriptor = unshield_get_file_descriptor(unshield,index);
    if (file_descriptor == (FileDescriptor *)0x0) {
      format = "Failed to get file descriptor for file %i";
      line = 0x3cb;
LAB_001039fa:
      _unshield_log(1,"unshield_file_save_raw",line,format,(ulong)(uint)index);
      goto LAB_00103a04;
    }
    if (((file_descriptor->flags & 8) != 0) || (file_descriptor->data_offset == 0))
    goto LAB_00103a04;
    if ((file_descriptor->link_flags & 1) != 0) {
      _Var7 = unshield_file_save_raw(unshield,file_descriptor->link_previous,filename);
      pvVar4 = (void *)0x0;
      reader = (UnshieldReader *)0x0;
      goto LAB_00103a0a;
    }
    reader = unshield_reader_create(unshield,index,file_descriptor);
    if (reader == (UnshieldReader *)0x0) {
      format = "Failed to create data reader for file %i";
      line = 0x3de;
      goto LAB_001039fa;
    }
    uVar3 = unshield_fsize(unshield,reader->volume_file);
    if (uVar3 != file_descriptor->data_offset) {
      if (filename == (char *)0x0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = (*unshield->io_callbacks->fopen)(filename,"wb",unshield->io_userdata);
        if (pvVar4 == (void *)0x0) {
          _unshield_log(1,"unshield_file_save_raw",0x3ed,"Failed to open output file \'%s\'",
                        filename);
          goto LAB_00103a07;
        }
      }
      uVar6 = *(uint *)(file_descriptor->md5 +
                       (ulong)(((byte)file_descriptor->flags & 4) >> 2) * 8 + -0x18);
      do {
        _Var7 = uVar6 == 0;
        if (_Var7) break;
        size = 0x10000;
        if (uVar6 < 0x10000) {
          size = (size_t)uVar6;
        }
        _Var2 = unshield_reader_read(reader,buffer,size);
        if (_Var2) {
          uVar6 = uVar6 - (int)size;
          bVar1 = true;
          if (pvVar4 != (void *)0x0) {
            sVar5 = (*unshield->io_callbacks->fwrite)(buffer,1,size,pvVar4,unshield->io_userdata);
            if (sVar5 == size) {
              bVar1 = true;
            }
            else {
              _unshield_log(1,"unshield_file_save_raw",0x40a,
                            "Failed to write %i bytes to file \'%s\'",size,filename);
              bVar1 = false;
            }
          }
        }
        else {
          _unshield_log(1,"unshield_file_save_raw",0x401,
                        "Failed to read %i bytes from input cabinet file %i",size,
                        (ulong)file_descriptor->volume);
          bVar1 = false;
        }
      } while (bVar1);
      goto LAB_00103a0a;
    }
    _unshield_log(1,"unshield_file_save_raw",0x3e4,"File %i is not inside the cabinet.",
                  (ulong)(uint)index);
  }
LAB_00103a07:
  pvVar4 = (void *)0x0;
  _Var7 = false;
LAB_00103a0a:
  unshield_reader_destroy(reader);
  if (pvVar4 != (void *)0x0) {
    (*unshield->io_callbacks->fclose)(pvVar4,unshield->io_userdata);
  }
  if (buffer != (void *)0x0) {
    free(buffer);
  }
  return _Var7;
}

Assistant:

bool unshield_file_save_raw(Unshield* unshield, int index, const char* filename)
{
  /* XXX: Thou Shalt Not Cut & Paste... */
  bool success = false;
  FILE* output = NULL;
  unsigned char* input_buffer   = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned char* output_buffer  = (unsigned char*)malloc(BUFFER_SIZE);
  unsigned int bytes_left;
  UnshieldReader* reader = NULL;
  FileDescriptor* file_descriptor;

  if (!unshield)
    goto exit;

  if (!(file_descriptor = unshield_get_file_descriptor(unshield, index)))
  {
    unshield_error("Failed to get file descriptor for file %i", index);
    goto exit;
  }

  if ((file_descriptor->flags & FILE_INVALID) || 0 == file_descriptor->data_offset)
  {
    /* invalid file */
    goto exit;
  }

  if (file_descriptor->link_flags & LINK_PREV)
  {
    success = unshield_file_save_raw(unshield, file_descriptor->link_previous, filename);
    goto exit;
  }

  reader = unshield_reader_create(unshield, index, file_descriptor);
  if (!reader)
  {
    unshield_error("Failed to create data reader for file %i", index);
    goto exit;
  }

  if (unshield_fsize(unshield, reader->volume_file) == (long)file_descriptor->data_offset)
  {
    unshield_error("File %i is not inside the cabinet.", index);
    goto exit;
  }

  if (filename) 
  {
    output = unshield_fopen(unshield, filename, "wb");
    if (!output)
    {
      unshield_error("Failed to open output file '%s'", filename);
      goto exit;
    }
  }

  if (file_descriptor->flags & FILE_COMPRESSED)
    bytes_left = file_descriptor->compressed_size;
  else
    bytes_left = file_descriptor->expanded_size;

  /*unshield_trace("Bytes to read: %i", bytes_left);*/

  while (bytes_left > 0)
  {
    uLong bytes_to_write = MIN(bytes_left, BUFFER_SIZE);

    if (!unshield_reader_read(reader, output_buffer, bytes_to_write))
    {
#if VERBOSE
      unshield_error("Failed to read %i bytes from input cabinet file %i", 
          bytes_to_write, file_descriptor->volume);
#endif
      goto exit;
    }

    bytes_left -= bytes_to_write;

      if (output) {
          if (bytes_to_write != unshield_fwrite(unshield, output_buffer, 1, bytes_to_write, output)) {
              unshield_error("Failed to write %i bytes to file '%s'", bytes_to_write, filename);
              goto exit;
          }
      }
  }

  success = true;
  
exit:
  unshield_reader_destroy(reader);
  FCLOSE(unshield, output);
  FREE(input_buffer);
  FREE(output_buffer);
  return success;
}